

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_enc.c
# Opt level: O1

int VP8EncWrite(VP8Encoder *enc)

{
  VP8EncProba *probas;
  int *percent_store;
  undefined2 uVar1;
  WebPPicture *pic;
  WebPAuxStats *pWVar2;
  WebPPicture *pWVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  uint32_t uVar9;
  undefined1 *puVar10;
  ulong uVar11;
  WebPPicture *pWVar12;
  ulong uVar13;
  VP8BitWriter *bw;
  VP8BitWriter *pVVar14;
  WebPEncodingError error;
  long lVar15;
  size_t sVar16;
  size_t *psVar17;
  bool bVar18;
  uint8_t pad_byte [1];
  uint8_t pad_byte_1 [1];
  uint8_t local_71;
  ulong local_70;
  byte local_68;
  undefined1 uStack_67;
  undefined1 uStack_66;
  undefined1 uStack_65;
  undefined1 uStack_64;
  undefined1 uStack_63;
  undefined1 uStack_62;
  undefined1 uStack_61;
  undefined2 uStack_60;
  undefined2 uStack_5e;
  undefined1 uStack_5c;
  undefined1 uStack_5b;
  undefined1 uStack_5a;
  undefined1 uStack_59;
  undefined2 local_58;
  ulong local_50;
  int local_48;
  int local_44;
  size_t local_40;
  uint8_t *local_38;
  
  pic = enc->pic_;
  pVVar14 = &enc->bw_;
  local_44 = (int)(0x13 / (long)enc->num_parts_);
  local_48 = enc->percent_;
  uVar7 = (enc->bw_).run_;
  sVar16 = (enc->bw_).pos_;
  iVar6 = enc->mb_w_ * enc->mb_h_ * 7;
  iVar5 = iVar6 + 7;
  if (-1 < iVar6) {
    iVar5 = iVar6;
  }
  iVar6 = (enc->bw_).nb_bits_;
  iVar5 = VP8BitWriterInit(pVVar14,(long)(iVar5 >> 3));
  if (iVar5 == 0) {
    pWVar12 = enc->pic_;
LAB_0013ac62:
    iVar6 = WebPEncodingSetError(pWVar12,VP8_ENC_ERROR_OUT_OF_MEMORY);
    if (iVar6 == 0) {
      return 0;
    }
  }
  else {
    local_70 = uVar7 + sVar16;
    VP8PutBitUniform(pVVar14,0);
    VP8PutBitUniform(pVVar14,0);
    probas = &enc->proba_;
    iVar5 = VP8PutBitUniform(pVVar14,(uint)(1 < (enc->segment_hdr_).num_segments_));
    if (iVar5 != 0) {
      VP8PutBitUniform(pVVar14,(enc->segment_hdr_).update_map_);
      iVar5 = VP8PutBitUniform(pVVar14,1);
      if (iVar5 != 0) {
        VP8PutBitUniform(pVVar14,1);
        lVar8 = 0;
        do {
          VP8PutSignedBits(pVVar14,*(int *)((long)&enc->dqm_[0].quant_ + lVar8),7);
          lVar8 = lVar8 + 0x2e8;
        } while (lVar8 != 0xba0);
        lVar8 = 0;
        do {
          VP8PutSignedBits(pVVar14,*(int *)((long)&enc->dqm_[0].fstrength_ + lVar8),6);
          lVar8 = lVar8 + 0x2e8;
        } while (lVar8 != 0xba0);
      }
      if ((enc->segment_hdr_).update_map_ != 0) {
        lVar8 = 0;
        do {
          iVar5 = VP8PutBitUniform(pVVar14,(uint)(probas->segments_[lVar8] != 0xff));
          if (iVar5 != 0) {
            VP8PutBits(pVVar14,(uint)probas->segments_[lVar8],8);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
      }
    }
    iVar5 = (enc->filter_hdr_).i4x4_lf_delta_;
    local_50 = (long)iVar6;
    VP8PutBitUniform(pVVar14,(enc->filter_hdr_).simple_);
    VP8PutBits(pVVar14,(enc->filter_hdr_).level_,6);
    uVar9 = 3;
    VP8PutBits(pVVar14,(enc->filter_hdr_).sharpness_,3);
    iVar6 = VP8PutBitUniform(pVVar14,(uint)(iVar5 != 0));
    if ((iVar6 != 0) &&
       (iVar6 = VP8PutBitUniform(pVVar14,(uint)((enc->filter_hdr_).i4x4_lf_delta_ != 0)), iVar6 != 0
       )) {
      VP8PutBits(pVVar14,0,4);
      VP8PutSignedBits(pVVar14,(enc->filter_hdr_).i4x4_lf_delta_,6);
      VP8PutBits(pVVar14,0,3);
    }
    iVar6 = enc->num_parts_;
    if (iVar6 == 4) {
      uVar9 = 2;
    }
    else if (iVar6 != 8) {
      uVar9 = (uint32_t)(iVar6 == 2);
    }
    VP8PutBits(pVVar14,uVar9,2);
    VP8PutBits(pVVar14,enc->base_quant_,7);
    VP8PutSignedBits(pVVar14,enc->dq_y1_dc_,4);
    VP8PutSignedBits(pVVar14,enc->dq_y2_dc_,4);
    VP8PutSignedBits(pVVar14,enc->dq_y2_ac_,4);
    VP8PutSignedBits(pVVar14,enc->dq_uv_dc_,4);
    VP8PutSignedBits(pVVar14,enc->dq_uv_ac_,4);
    VP8PutBitUniform(pVVar14,0);
    VP8WriteProbas(pVVar14,probas);
    lVar8 = (long)(enc->bw_).nb_bits_;
    sVar16 = (enc->bw_).pos_;
    uVar7 = (enc->bw_).run_;
    VP8CodeIntraModes(enc);
    VP8BitWriterFinish(pVVar14);
    pWVar12 = enc->pic_;
    pWVar2 = pWVar12->stats;
    if (pWVar2 != (WebPAuxStats *)0x0) {
      sVar4 = (enc->bw_).pos_;
      iVar6 = (enc->bw_).run_;
      iVar5 = (enc->bw_).nb_bits_;
      lVar15 = sVar16 + uVar7;
      pWVar2->header_bytes[0] = (int)(lVar8 + lVar15 * 8 + ~(local_50 + local_70 * 8) + 8 >> 3);
      pWVar2->header_bytes[1] =
           (int)(((long)iVar5 - (lVar8 + lVar15 * 8 + 8)) + 0xfU >> 3) + (int)sVar4 + iVar6;
      pWVar2->alpha_data_size = enc->alpha_data_size_;
    }
    if ((enc->bw_).error_ != 0) goto LAB_0013ac62;
  }
  sVar16 = (enc->bw_).pos_;
  iVar6 = enc->num_parts_;
  lVar8 = sVar16 + (long)(iVar6 * 3 + -3) + 10;
  if (0 < (long)iVar6) {
    lVar15 = 0;
    do {
      lVar8 = lVar8 + *(long *)((long)&enc->parts_[0].pos_ + lVar15);
      lVar15 = lVar15 + 0x30;
    } while ((long)iVar6 * 0x30 != lVar15);
  }
  uVar11 = (ulong)((uint)lVar8 & 1);
  bVar18 = enc->has_alpha_ == 0;
  lVar15 = uVar11 + 0x1e;
  if (bVar18) {
    lVar15 = uVar11 + 0xc;
  }
  uVar13 = lVar15 + lVar8;
  if (!bVar18) {
    uVar13 = uVar13 + (enc->alpha_data_size_ + (enc->alpha_data_size_ & 1) + 8);
  }
  if (0xfffffffe < uVar13) {
    iVar6 = WebPEncodingSetError(pic,VP8_ENC_ERROR_FILE_TOO_BIG);
    return iVar6;
  }
  pWVar12 = enc->pic_;
  local_38 = (enc->bw_).buf_;
  local_68 = 0x52;
  uStack_67 = 0x49;
  uStack_66 = 0x46;
  uStack_65 = 0x46;
  uStack_60 = 0x4557;
  uStack_5e = 0x5042;
  uStack_64 = (undefined1)uVar13;
  uStack_63 = (undefined1)(uVar13 >> 8);
  uStack_62 = (undefined1)(uVar13 >> 0x10);
  uStack_61 = (undefined1)(uVar13 >> 0x18);
  local_70 = uVar11;
  local_50 = uVar13;
  iVar6 = (*pWVar12->writer)(&local_68,0xc,pWVar12);
  bVar18 = iVar6 == 0;
  if (bVar18) {
LAB_0013aef6:
    error = (uint)bVar18 << 3;
LAB_0013aefd:
    iVar6 = WebPEncodingSetError(pWVar12,error);
    if (iVar6 != 0) goto LAB_0013af12;
  }
  else {
    if (enc->has_alpha_ != 0) {
      pWVar3 = enc->pic_;
      local_68 = 0x56;
      uStack_67 = 0x50;
      uStack_66 = 0x38;
      uStack_65 = 0x58;
      uStack_64 = 10;
      uStack_63 = 0;
      uStack_62 = 0;
      uStack_61 = 0;
      uStack_60 = 0x10;
      uStack_5e = 0;
      iVar6 = pWVar3->width + -1;
      uStack_5c = (undefined1)iVar6;
      uStack_5b = (undefined1)((uint)iVar6 >> 8);
      uStack_5a = (undefined1)((uint)iVar6 >> 0x10);
      iVar6 = pWVar3->height + -1;
      uStack_59 = (undefined1)iVar6;
      local_58 = (undefined2)((uint)iVar6 >> 8);
      iVar6 = (*pWVar3->writer)(&local_68,0x12,pWVar3);
      bVar18 = iVar6 == 0;
      if (bVar18) goto LAB_0013aef6;
    }
    if (enc->has_alpha_ != 0) {
      pWVar3 = enc->pic_;
      local_68 = 0x41;
      uStack_67 = 0x4c;
      uStack_66 = 0x50;
      uStack_65 = 0x48;
      uVar9 = enc->alpha_data_size_;
      uStack_64 = (undefined1)uVar9;
      uStack_63 = (undefined1)(uVar9 >> 8);
      uStack_62 = (undefined1)(uVar9 >> 0x10);
      uStack_61 = (undefined1)(uVar9 >> 0x18);
      local_40 = sVar16;
      iVar6 = (*pWVar3->writer)(&local_68,8,pWVar3);
      error = VP8_ENC_ERROR_BAD_WRITE;
      if ((iVar6 == 0) ||
         (iVar6 = (*pWVar3->writer)(enc->alpha_data_,(ulong)enc->alpha_data_size_,pWVar3),
         iVar6 == 0)) {
LAB_0013ae3c:
        bVar18 = false;
      }
      else {
        if ((enc->alpha_data_size_ & 1) != 0) {
          local_71 = '\0';
          iVar6 = (*pWVar3->writer)(&local_71,1,pWVar3);
          if (iVar6 == 0) goto LAB_0013ae3c;
        }
        error = VP8_ENC_OK;
        bVar18 = true;
      }
      sVar16 = local_40;
      if (bVar18) goto LAB_0013ae4b;
      goto LAB_0013aefd;
    }
LAB_0013ae4b:
    lVar8 = lVar8 + local_70;
    local_68 = 0x56;
    uStack_67 = 0x50;
    uStack_66 = 0x38;
    uStack_65 = 0x20;
    uStack_64 = (undefined1)lVar8;
    uStack_63 = (undefined1)((ulong)lVar8 >> 8);
    uStack_62 = (undefined1)((ulong)lVar8 >> 0x10);
    uStack_61 = (undefined1)((ulong)lVar8 >> 0x18);
    iVar6 = (*pWVar12->writer)(&local_68,8,pWVar12);
    bVar18 = iVar6 == 0;
    if (bVar18) goto LAB_0013aef6;
    error = VP8_ENC_ERROR_PARTITION0_OVERFLOW;
    if (sVar16 < 0x80000) {
      uVar7 = (int)sVar16 << 5 | enc->profile_ * 2;
      local_68 = (byte)uVar7 | 0x10;
      uStack_67 = (undefined1)(uVar7 >> 8);
      uStack_66 = (undefined1)(uVar7 >> 0x10);
      uStack_65 = 0x9d;
      uStack_64 = 1;
      uStack_63 = 0x2a;
      uVar1 = (undefined2)pWVar12->width;
      uStack_62 = (undefined1)uVar1;
      uStack_61 = (undefined1)((ushort)uVar1 >> 8);
      uStack_60 = (undefined2)pWVar12->height;
      iVar6 = (*pWVar12->writer)(&local_68,10,pWVar12);
      error = (uint)(iVar6 == 0) << 3;
    }
    if (error != VP8_ENC_OK) goto LAB_0013aefd;
LAB_0013af12:
    iVar6 = (*pic->writer)(local_38,sVar16,pic);
    if (iVar6 != 0) {
      lVar8 = 0;
      if (1 < enc->num_parts_) {
        puVar10 = &uStack_66;
        psVar17 = &enc->parts_[0].pos_;
        lVar8 = 0;
        do {
          uVar11 = *psVar17;
          if (0xffffff < uVar11) {
            iVar6 = WebPEncodingSetError(pic,VP8_ENC_ERROR_PARTITION_OVERFLOW);
            goto LAB_0013afbd;
          }
          puVar10[-2] = (char)uVar11;
          puVar10[-1] = (char)(uVar11 >> 8);
          *puVar10 = (char)(uVar11 >> 0x10);
          lVar8 = lVar8 + 1;
          puVar10 = puVar10 + 3;
          psVar17 = psVar17 + 6;
        } while (lVar8 < (long)enc->num_parts_ + -1);
      }
      if ((int)lVar8 == 0) {
        iVar6 = 1;
      }
      else {
        iVar6 = (*pic->writer)(&local_68,(ulong)(uint)((int)lVar8 * 3),pic);
      }
LAB_0013afbd:
      bVar18 = iVar6 != 0;
      goto LAB_0013afc4;
    }
  }
  bVar18 = false;
LAB_0013afc4:
  percent_store = &enc->percent_;
  VP8BitWriterWipeOut(pVVar14);
  if (0 < enc->num_parts_) {
    pVVar14 = enc->parts_;
    lVar8 = 0;
    do {
      if (pVVar14->pos_ != 0) {
        if (bVar18) {
          iVar6 = (*pic->writer)(pVVar14->buf_,pVVar14->pos_,pic);
          bVar18 = iVar6 != 0;
        }
        else {
          bVar18 = false;
        }
      }
      VP8BitWriterWipeOut(pVVar14);
      if (bVar18) {
        iVar6 = WebPReportProgress(pic,*percent_store + local_44,percent_store);
        bVar18 = iVar6 != 0;
      }
      else {
        bVar18 = false;
      }
      lVar8 = lVar8 + 1;
      pVVar14 = pVVar14 + 1;
    } while (lVar8 < enc->num_parts_);
  }
  if ((bVar18) && (local_70 != 0)) {
    local_68 = 0;
    iVar6 = (*pic->writer)(&local_68,1,pic);
    bVar18 = iVar6 != 0;
  }
  enc->coded_size_ = (int)local_50 + 8;
  if (!bVar18) {
    return 0;
  }
  iVar6 = WebPReportProgress(pic,local_48 + 0x13,percent_store);
  return (uint)(iVar6 != 0);
}

Assistant:

int VP8EncWrite(VP8Encoder* const enc) {
  WebPPicture* const pic = enc->pic_;
  VP8BitWriter* const bw = &enc->bw_;
  const int task_percent = 19;
  const int percent_per_part = task_percent / enc->num_parts_;
  const int final_percent = enc->percent_ + task_percent;
  int ok = 0;
  size_t vp8_size, pad, riff_size;
  int p;

  // Partition #0 with header and partition sizes
  ok = GeneratePartition0(enc);
  if (!ok) return 0;

  // Compute VP8 size
  vp8_size = VP8_FRAME_HEADER_SIZE +
             VP8BitWriterSize(bw) +
             3 * (enc->num_parts_ - 1);
  for (p = 0; p < enc->num_parts_; ++p) {
    vp8_size += VP8BitWriterSize(enc->parts_ + p);
  }
  pad = vp8_size & 1;
  vp8_size += pad;

  // Compute RIFF size
  // At the minimum it is: "WEBPVP8 nnnn" + VP8 data size.
  riff_size = TAG_SIZE + CHUNK_HEADER_SIZE + vp8_size;
  if (IsVP8XNeeded(enc)) {  // Add size for: VP8X header + data.
    riff_size += CHUNK_HEADER_SIZE + VP8X_CHUNK_SIZE;
  }
  if (enc->has_alpha_) {  // Add size for: ALPH header + data.
    const uint32_t padded_alpha_size = enc->alpha_data_size_ +
                                       (enc->alpha_data_size_ & 1);
    riff_size += CHUNK_HEADER_SIZE + padded_alpha_size;
  }
  // RIFF size should fit in 32-bits.
  if (riff_size > 0xfffffffeU) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_FILE_TOO_BIG);
  }

  // Emit headers and partition #0
  {
    const uint8_t* const part0 = VP8BitWriterBuf(bw);
    const size_t size0 = VP8BitWriterSize(bw);
    ok = ok && PutWebPHeaders(enc, size0, vp8_size, riff_size)
            && pic->writer(part0, size0, pic)
            && EmitPartitionsSize(enc, pic);
    VP8BitWriterWipeOut(bw);    // will free the internal buffer.
  }

  // Token partitions
  for (p = 0; p < enc->num_parts_; ++p) {
    const uint8_t* const buf = VP8BitWriterBuf(enc->parts_ + p);
    const size_t size = VP8BitWriterSize(enc->parts_ + p);
    if (size) ok = ok && pic->writer(buf, size, pic);
    VP8BitWriterWipeOut(enc->parts_ + p);    // will free the internal buffer.
    ok = ok && WebPReportProgress(pic, enc->percent_ + percent_per_part,
                                  &enc->percent_);
  }

  // Padding byte
  if (ok && pad) {
    ok = PutPaddingByte(pic);
  }

  enc->coded_size_ = (int)(CHUNK_HEADER_SIZE + riff_size);
  ok = ok && WebPReportProgress(pic, final_percent, &enc->percent_);
  return ok;
}